

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Extrapolater.cpp
# Opt level: O0

void amrex::Extrapolater::FirstOrderExtrap
               (MultiFab *mf,Geometry *geom,int scomp,int ncomp,int ngrow)

{
  int iVar1;
  int iVar2;
  BATType BVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pBVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  BATType BVar12;
  BoxArray *bxs;
  iMultiFab *this;
  FabArrayBase *fabarray_;
  int in_ECX;
  Geometry *in_RSI;
  FabArrayBase *in_RDI;
  int in_R8D;
  Array4<double> *data_arr;
  Array4<const_int> *mask_arr;
  Box result;
  Box *gbx;
  Box *bx;
  MFIter mfi;
  int layer;
  iMultiFab mask;
  int i_30;
  int j_30;
  int k_30;
  int i_29;
  int j_29;
  int k_29;
  int i_28;
  int k_28;
  int j_28;
  int i_27;
  int k_27;
  int j_27;
  int j_26;
  int k_26;
  int i_26;
  int j_25;
  int k_25;
  int i_25;
  int i_24;
  int k_24;
  int j_24;
  int i_23;
  int k_23;
  int j_23;
  int i_22;
  int k_22;
  int j_22;
  int i_21;
  int k_21;
  int j_21;
  int j_20;
  int k_20;
  int i_20;
  int j_19;
  int k_19;
  int i_19;
  int j_18;
  int k_18;
  int i_18;
  int j_17;
  int k_17;
  int i_17;
  int k_16;
  int j_16;
  int i_16;
  int k_15;
  int j_15;
  int i_15;
  int k_14;
  int j_14;
  int i_14;
  int k_13;
  int j_13;
  int i_13;
  int k_12;
  int j_12;
  int i_12;
  int k_11;
  int j_11;
  int i_11;
  int k_10;
  int j_10;
  int i_10;
  int k_9;
  int j_9;
  int i_9;
  int k_8;
  int j_8;
  int i_8;
  int k_7;
  int j_7;
  int i_7;
  int k_6;
  int j_6;
  int i_6;
  int k_5;
  int j_5;
  int i_5;
  int j_4;
  int k_4;
  int j_3;
  int k_3;
  int i_4;
  int i_3;
  int k_2;
  int i_2;
  int k_1;
  int j_2;
  int i_1;
  int j_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int crsecell;
  int finecell;
  element_type *in_stack_ffffffffffffb680;
  FabArray<amrex::IArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffb690;
  MFInfo *in_stack_ffffffffffffb6a0;
  undefined8 in_stack_ffffffffffffb6a8;
  Geometry *this_01;
  __uniq_ptr_impl<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
  *factory;
  MFInfo local_4928;
  MFInfo *local_48e8;
  undefined8 local_48a0;
  undefined8 local_4898;
  BATType BStack_4890;
  undefined1 local_488c [68];
  element_type *local_4848;
  MFIter local_4840;
  int local_47dc;
  IntVect local_47d8;
  RefID local_47c8;
  int local_47c0;
  MultiArray4<const_double> local_47b0;
  __uniq_ptr_impl<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
  local_47a8;
  DataAllocator DStack_47a0;
  pointer local_4798;
  pointer ppIStack_4790;
  pointer local_4788;
  value_type in_stack_ffffffffffffb884;
  value_type in_stack_ffffffffffffb888;
  value_type in_stack_ffffffffffffb88c;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  in_stack_ffffffffffffb890;
  unique_ptr<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  in_stack_ffffffffffffb898;
  FabArray<amrex::IArrayBox> *in_stack_ffffffffffffb8a0;
  int local_45d0;
  int local_45cc;
  int local_45c4;
  int local_45c0;
  int local_45b8;
  BATType local_45b4;
  int local_45ac;
  BATType local_45a8;
  int local_45a0;
  BATType local_459c;
  int local_4594;
  value_type in_stack_ffffffffffffba70;
  int local_4588;
  int local_457c;
  int local_4570;
  int local_4564;
  int local_4558;
  int local_454c;
  int local_4540;
  int local_4534;
  BATType local_4528;
  BATType local_451c;
  BATType local_4510;
  BATType local_4504;
  int local_4498;
  int local_4494;
  int local_4490;
  int local_448c;
  int local_4484;
  int local_4480;
  int local_447c;
  int local_4478;
  int local_4470;
  int local_446c;
  int local_4468;
  int local_4464;
  int local_445c;
  
  bxs = FabArrayBase::boxArray(in_RDI);
  this = (iMultiFab *)FabArrayBase::DistributionMap(in_RDI);
  local_4798 = (pointer)0x0;
  ppIStack_4790 = (pointer)0x0;
  local_47a8._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_false>._M_head_impl =
       (tuple<amrex::FabFactory<amrex::IArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
        )(_Tuple_impl<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
          )0x0;
  DStack_47a0.m_arena = (Arena *)0x0;
  local_4788 = (pointer)0x0;
  factory = &local_47a8;
  MFInfo::MFInfo((MFInfo *)0x112286d);
  local_47b0.hp = (Array4<const_double> *)0x0;
  this_01 = (Geometry *)&local_47b0;
  DefaultFabFactory<amrex::IArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::IArrayBox> *)in_stack_ffffffffffffb680);
  iMultiFab::iMultiFab
            (this,bxs,(DistributionMapping *)this_01,(int)((ulong)in_stack_ffffffffffffb6a8 >> 0x20)
             ,(int)in_stack_ffffffffffffb6a8,in_stack_ffffffffffffb6a0,
             (FabFactory<amrex::IArrayBox> *)factory);
  DefaultFabFactory<amrex::IArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::IArrayBox> *)0x11228cb);
  MFInfo::~MFInfo((MFInfo *)0x11228d8);
  fabarray_ = (FabArrayBase *)Geometry::Domain(in_RSI);
  local_47d8.vect = (int  [3])Geometry::periodicity(this_01);
  local_47c0 = local_47d8.vect[2];
  local_47c8.data = (BARef *)local_47d8.vect._0_8_;
  FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
            (in_stack_ffffffffffffb8a0,
             (Box *)in_stack_ffffffffffffb898._M_t.
                    super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                    .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl,
             (Periodicity *)
             in_stack_ffffffffffffb890._M_t.
             super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl,
             in_stack_ffffffffffffb88c,in_stack_ffffffffffffb888,in_stack_ffffffffffffb884,
             in_stack_ffffffffffffba70);
  for (local_47dc = 0; local_47dc < in_R8D; local_47dc = local_47dc + 1) {
    MFIter::MFIter((MFIter *)this_01,fabarray_,(uchar)((ulong)in_stack_ffffffffffffb6a0 >> 0x38));
    while (bVar8 = MFIter::isValid(&local_4840), bVar8) {
      in_stack_ffffffffffffb680 = (element_type *)(local_488c + 0x28);
      MFIter::validbox((MFIter *)in_stack_ffffffffffffb690);
      local_4898 = ((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                   &(in_stack_ffffffffffffb680->m_abox).
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start)->_M_head_impl;
      pBVar7 = (in_stack_ffffffffffffb680->m_abox).
               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_488c._8_8_ =
           *(undefined8 *)
            ((long)&(in_stack_ffffffffffffb680->m_abox).
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 4);
      local_488c._4_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)
                    ((long)&(in_stack_ffffffffffffb680->m_abox).
                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4) >> 0x20);
      BStack_4890 = (BATType)pBVar7;
      local_488c._0_4_ = (undefined4)((ulong)pBVar7 >> 0x20);
      this_00 = (FabArray<amrex::IArrayBox> *)&stack0xffffffffffffb768;
      local_4848 = in_stack_ffffffffffffb680;
      Box::grow((Box *)this_00,local_47dc);
      in_stack_ffffffffffffb690 = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffb720;
      local_488c._28_8_ = this_00;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (this_00,(MFIter *)in_stack_ffffffffffffb680);
      in_stack_ffffffffffffb6a0 = &local_4928;
      local_48a0 = in_stack_ffffffffffffb690;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffb690,(MFIter *)this_00,
                 (int)((ulong)in_stack_ffffffffffffb680 >> 0x20));
      iVar1 = *(int *)local_488c._28_8_;
      iVar2 = *(int *)(local_488c._28_8_ + 4);
      BVar3 = (((BoxArray *)(local_488c._28_8_ + 8))->m_bat).m_bat_type;
      iVar4 = *(int *)(local_488c._28_8_ + 0xc);
      iVar5 = *(int *)(local_488c._28_8_ + 0x10);
      iVar6 = *(int *)(local_488c._28_8_ + 0x14);
      for (local_445c = 0; local_445c < in_ECX; local_445c = local_445c + 1) {
        for (local_4464 = iVar2 + -1; local_4464 <= iVar5 + 1; local_4464 = local_4464 + 1) {
          for (local_4468 = iVar1 + -1; local_4468 <= iVar4 + 1; local_4468 = local_4468 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(local_4468 - *(int *)(local_48a0 + 0x20)) +
                         (long)(local_4464 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(int)((BVar3 - indexType) - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(undefined8 *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_4468 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4464 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)((BVar3 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) = 0;
            }
          }
        }
        for (local_446c = iVar2 + -1; local_446c <= iVar5 + 1; local_446c = local_446c + 1) {
          for (local_4470 = iVar1 + -1; local_4470 <= iVar4 + 1; local_4470 = local_4470 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(local_4470 - *(int *)(local_48a0 + 0x20)) +
                         (long)(local_446c - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)((iVar6 + 1) - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(undefined8 *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_4470 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_446c -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)((iVar6 + 1) - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) = 0;
            }
          }
        }
        for (local_4478 = BVar3 - indexType; local_4478 <= iVar6 + 1; local_4478 = local_4478 + 1) {
          for (local_447c = iVar1 + -1; local_447c <= iVar4 + 1; local_447c = local_447c + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(local_447c - *(int *)(local_48a0 + 0x20)) +
                         (long)((iVar2 + -1) - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(local_4478 - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(undefined8 *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_447c -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)((iVar2 + -1) -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(local_4478 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) = 0;
            }
          }
        }
        for (local_4480 = BVar3 - indexType; local_4480 <= iVar6 + 1; local_4480 = local_4480 + 1) {
          for (local_4484 = iVar1 + -1; local_4484 <= iVar4 + 1; local_4484 = local_4484 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(local_4484 - *(int *)(local_48a0 + 0x20)) +
                         (long)((iVar5 + 1) - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(local_4480 - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(undefined8 *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_4484 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)((iVar5 + 1) -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(local_4480 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) = 0;
            }
          }
        }
        for (local_448c = BVar3 - indexType; local_448c <= iVar6 + 1; local_448c = local_448c + 1) {
          for (local_4490 = iVar2 + -1; local_4490 <= iVar5 + 1; local_4490 = local_4490 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)((iVar1 + -1) - *(int *)(local_48a0 + 0x20)) +
                         (long)(local_4490 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(local_448c - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(undefined8 *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)((iVar1 + -1) -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4490 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(local_448c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) = 0;
            }
          }
        }
        for (local_4494 = BVar3 - indexType; local_4494 <= iVar6 + 1; local_4494 = local_4494 + 1) {
          for (local_4498 = iVar2 + -1; local_4498 <= iVar5 + 1; local_4498 = local_4498 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)((iVar4 + 1) - *(int *)(local_48a0 + 0x20)) +
                         (long)(local_4498 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(local_4494 - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(undefined8 *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)((iVar4 + 1) -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4498 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(local_4494 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) = 0;
            }
          }
        }
        iVar9 = iVar1 + -1;
        iVar10 = iVar2 + -1;
        iVar11 = BVar3 - indexType;
        if (*(int *)(*(long *)local_48a0 +
                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                    (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) * 4
                    ) == 0) {
          if (((*(int *)(*(long *)local_48a0 +
                        ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1) ||
              (*(int *)(*(long *)local_48a0 +
                       ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                        (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                        *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                       (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                       * 4) == 1)) ||
             (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                      *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else if (((*(int *)(*(long *)local_48a0 +
                             ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                              (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                              *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                             (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                             *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                   (*(int *)(*(long *)local_48a0 +
                            ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                             (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                             *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                            (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                            *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                  (*(int *)(*(long *)local_48a0 +
                           ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else {
            *(undefined8 *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 *(undefined8 *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8);
          }
        }
        iVar9 = iVar1 + -1;
        iVar10 = iVar2 + -1;
        iVar11 = iVar6 + 1;
        if (*(int *)(*(long *)local_48a0 +
                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                    (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) * 4
                    ) == 0) {
          if (((*(int *)(*(long *)local_48a0 +
                        ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1) ||
              (*(int *)(*(long *)local_48a0 +
                       ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                        (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                        *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                       (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                       * 4) == 1)) ||
             (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar6 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else if (((*(int *)(*(long *)local_48a0 +
                             ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                              (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                              *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                             (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                             *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                   (*(int *)(*(long *)local_48a0 +
                            ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                             (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                             *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                            (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                            *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                  (*(int *)(*(long *)local_48a0 +
                           ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else {
            *(undefined8 *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 *(undefined8 *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8);
          }
        }
        iVar9 = iVar1 + -1;
        iVar10 = iVar5 + 1;
        iVar11 = BVar3 - indexType;
        if (*(int *)(*(long *)local_48a0 +
                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                    (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) * 4
                    ) == 0) {
          if (((*(int *)(*(long *)local_48a0 +
                        ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1) ||
              (*(int *)(*(long *)local_48a0 +
                       ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                        (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                        *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                       (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                       * 4) == 1)) ||
             (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                      *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else if (((*(int *)(*(long *)local_48a0 +
                             ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                              (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                              *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                             (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                             *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                   (*(int *)(*(long *)local_48a0 +
                            ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                             (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                             *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                            (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                            *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                  (*(int *)(*(long *)local_48a0 +
                           ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else {
            *(undefined8 *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 *(undefined8 *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8);
          }
        }
        iVar9 = iVar1 + -1;
        iVar10 = iVar5 + 1;
        iVar11 = iVar6 + 1;
        if (*(int *)(*(long *)local_48a0 +
                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                    (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) * 4
                    ) == 0) {
          if (((*(int *)(*(long *)local_48a0 +
                        ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1) ||
              (*(int *)(*(long *)local_48a0 +
                       ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                        (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                        *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                       (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                       * 4) == 1)) ||
             (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar6 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else if (((*(int *)(*(long *)local_48a0 +
                             ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                              (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                              *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                             (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                             *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                   (*(int *)(*(long *)local_48a0 +
                            ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                             (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                             *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                            (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                            *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                  (*(int *)(*(long *)local_48a0 +
                           ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else {
            *(undefined8 *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 *(undefined8 *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8);
          }
        }
        iVar9 = iVar4 + 1;
        iVar10 = iVar2 + -1;
        iVar11 = BVar3 - indexType;
        if (*(int *)(*(long *)local_48a0 +
                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                    (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) * 4
                    ) == 0) {
          if (((*(int *)(*(long *)local_48a0 +
                        ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1) ||
              (*(int *)(*(long *)local_48a0 +
                       ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                        (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                        *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                       (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                       * 4) == 1)) ||
             (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                      *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else if (((*(int *)(*(long *)local_48a0 +
                             ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                              (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                              *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                             (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                             *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                   (*(int *)(*(long *)local_48a0 +
                            ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                             (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                             *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                            (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                            *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                  (*(int *)(*(long *)local_48a0 +
                           ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else {
            *(undefined8 *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 *(undefined8 *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8);
          }
        }
        iVar9 = iVar4 + 1;
        iVar10 = iVar2 + -1;
        iVar11 = iVar6 + 1;
        if (*(int *)(*(long *)local_48a0 +
                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                    (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) * 4
                    ) == 0) {
          if (((*(int *)(*(long *)local_48a0 +
                        ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1) ||
              (*(int *)(*(long *)local_48a0 +
                       ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                        (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                        *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                       (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                       * 4) == 1)) ||
             (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar6 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else if (((*(int *)(*(long *)local_48a0 +
                             ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                              (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                              *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                             (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                             *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                   (*(int *)(*(long *)local_48a0 +
                            ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                             (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                             *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                            (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                            *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                  (*(int *)(*(long *)local_48a0 +
                           ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else {
            *(undefined8 *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 *(undefined8 *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8);
          }
        }
        iVar9 = iVar4 + 1;
        iVar10 = iVar5 + 1;
        iVar11 = BVar3 - indexType;
        if (*(int *)(*(long *)local_48a0 +
                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                    (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) * 4
                    ) == 0) {
          if (((*(int *)(*(long *)local_48a0 +
                        ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1) ||
              (*(int *)(*(long *)local_48a0 +
                       ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                        (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                        *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                       (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                       * 4) == 1)) ||
             (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                      *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else if (((*(int *)(*(long *)local_48a0 +
                             ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                              (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                              *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                             (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                             *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                   (*(int *)(*(long *)local_48a0 +
                            ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                             (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                             *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                            (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                            *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                  (*(int *)(*(long *)local_48a0 +
                           ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else {
            *(undefined8 *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 *(undefined8 *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8);
          }
        }
        iVar9 = iVar4 + 1;
        iVar10 = iVar5 + 1;
        iVar11 = iVar6 + 1;
        if (*(int *)(*(long *)local_48a0 +
                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                    (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) * 4
                    ) == 0) {
          if (((*(int *)(*(long *)local_48a0 +
                        ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1) ||
              (*(int *)(*(long *)local_48a0 +
                       ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                        (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                        *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                       (long)(iVar11 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                       * 4) == 1)) ||
             (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar6 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else if (((*(int *)(*(long *)local_48a0 +
                             ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                              (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                              *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                             (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                             *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                   (*(int *)(*(long *)local_48a0 +
                            ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                             (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                             *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                            (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                            *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                  (*(int *)(*(long *)local_48a0 +
                           ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
            *(double *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 ((double)*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) *
                  *(double *)
                   (*(long *)in_stack_ffffffffffffb6a0 +
                   ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                    (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                    (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)local_445c *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                 (double)*(int *)(*(long *)local_48a0 +
                                 ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4) *
                 *(double *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                      
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                 (double)(*(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar11 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                          *(int *)(*(long *)local_48a0 +
                                  ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                   *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                  (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                  *(long *)(local_48a0 + 0x10)) * 4) +
                         *(int *)(*(long *)local_48a0 +
                                 ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                  (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                  *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                 (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                 *(long *)(local_48a0 + 0x10)) * 4));
          }
          else {
            *(undefined8 *)
             (*(long *)in_stack_ffffffffffffb6a0 +
             ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) +
              (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      )) * (long)in_stack_ffffffffffffb6a0->arena +
              (long)(iVar11 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
              (long)(in_stack_ffffffffffffb6a0->tags).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
             (long)local_445c *
             (long)(in_stack_ffffffffffffb6a0->tags).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                 *(undefined8 *)
                  (*(long *)in_stack_ffffffffffffb6a0 +
                  ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                   (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                   (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                   (long)(in_stack_ffffffffffffb6a0->tags).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)local_445c *
                  (long)(in_stack_ffffffffffffb6a0->tags).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) * 8);
          }
        }
        iVar9 = iVar1 + -1;
        iVar10 = iVar2 + -1;
        for (local_4504 = BVar3; (int)local_4504 <= iVar6; local_4504 = local_4504 + indexType) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(int)(local_4504 - *(int *)(local_48a0 + 0x28)) *
                      *(long *)(local_48a0 + 0x10)) * 4) == 0) {
            if (((*(int *)(*(long *)local_48a0 +
                          ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                           (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(int)(local_4504 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)(local_4504 - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
               ((*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)((local_4504 - indexType) - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1 ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)((local_4504 + indexType) - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)))) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_4504 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4504 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                            
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_4504 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4504 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4504 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_4504 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_4504 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_4504 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_4504 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_4504 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_4504 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4504 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4504 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_4504 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4504 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_4504 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4504 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4504 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4504 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4504 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4504 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4504 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_4504 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4504 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4504 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4504 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4504 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar1 + -1;
        iVar10 = iVar5 + 1;
        for (local_4510 = BVar3; (int)local_4510 <= iVar6; local_4510 = local_4510 + indexType) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(int)(local_4510 - *(int *)(local_48a0 + 0x28)) *
                      *(long *)(local_48a0 + 0x10)) * 4) == 0) {
            if (((*(int *)(*(long *)local_48a0 +
                          ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                           (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(int)(local_4510 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)(local_4510 - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
               ((*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)((local_4510 - indexType) - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1 ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)((local_4510 + indexType) - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)))) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_4510 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4510 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                            
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_4510 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4510 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4510 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_4510 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_4510 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_4510 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_4510 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_4510 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_4510 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4510 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4510 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_4510 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4510 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_4510 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4510 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4510 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4510 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4510 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4510 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4510 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_4510 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4510 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4510 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4510 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4510 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar4 + 1;
        iVar10 = iVar2 + -1;
        for (local_451c = BVar3; (int)local_451c <= iVar6; local_451c = local_451c + indexType) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(int)(local_451c - *(int *)(local_48a0 + 0x28)) *
                      *(long *)(local_48a0 + 0x10)) * 4) == 0) {
            if ((((*(int *)(*(long *)local_48a0 +
                           ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(int)(local_451c - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                 (*(int *)(*(long *)local_48a0 +
                          ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                           (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(int)(local_451c - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)((local_451c - indexType) - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
               (*(int *)(*(long *)local_48a0 +
                        ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(int)((local_451c + indexType) - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_451c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_451c + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                            
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_451c + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_451c - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_451c - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_451c - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_451c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_451c - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_451c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_451c - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_451c - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_451c - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_451c + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_451c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_451c + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_451c + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_451c - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_451c - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_451c + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_451c + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_451c - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_451c - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_451c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_451c - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_451c + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_451c - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_451c + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar4 + 1;
        iVar10 = iVar5 + 1;
        for (local_4528 = BVar3; (int)local_4528 <= iVar6; local_4528 = local_4528 + indexType) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(int)(local_4528 - *(int *)(local_48a0 + 0x28)) *
                      *(long *)(local_48a0 + 0x10)) * 4) == 0) {
            if (((*(int *)(*(long *)local_48a0 +
                          ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                           (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(int)(local_4528 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)(local_4528 - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
               ((*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)((local_4528 - indexType) - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1 ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)((local_4528 + indexType) - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)))) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_4528 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4528 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                            
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_4528 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4528 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4528 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_4528 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_4528 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_4528 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_4528 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_4528 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_4528 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4528 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4528 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_4528 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4528 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_4528 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4528 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4528 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4528 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4528 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4528 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar10 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_4528 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_4528 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4528 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar10 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4528 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_4528 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_4528 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar1 + -1;
        iVar10 = BVar3 - indexType;
        for (local_4534 = iVar2; local_4534 <= iVar5; local_4534 = local_4534 + 1) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(local_4534 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 0) {
            if (((*(int *)(*(long *)local_48a0 +
                          ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                           (long)(local_4534 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)((local_4534 + -1) - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1)) ||
               ((*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)((local_4534 + 1) - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1 ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(local_4534 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)))) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4534 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_4534 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_4534 -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4534 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4534 + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_4534 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_4534 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4534 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4534 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_4534 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4534 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4534 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_4534 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4534 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4534 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)((local_4534 + 1) -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4534 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4534 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4534 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4534 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4534 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4534 + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_4534 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4534 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4534 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4534 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4534 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar1 + -1;
        iVar10 = iVar6 + 1;
        for (local_4540 = iVar2; local_4540 <= iVar5; local_4540 = local_4540 + 1) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(local_4540 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 0) {
            if ((((*(int *)(*(long *)local_48a0 +
                           ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                            (long)(local_4540 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                 (*(int *)(*(long *)local_48a0 +
                          ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                           (long)((local_4540 + -1) - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)((local_4540 + 1) - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1)) ||
               (*(int *)(*(long *)local_48a0 +
                        ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                         (long)(local_4540 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar6 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1)) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4540 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_4540 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_4540 -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4540 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4540 + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_4540 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_4540 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4540 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4540 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_4540 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4540 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4540 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_4540 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4540 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4540 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)((local_4540 + 1) -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4540 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4540 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4540 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4540 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4540 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4540 + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_4540 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4540 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar1 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4540 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4540 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4540 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar4 + 1;
        iVar10 = BVar3 - indexType;
        for (local_454c = iVar2; local_454c <= iVar5; local_454c = local_454c + 1) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(local_454c - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 0) {
            if (((*(int *)(*(long *)local_48a0 +
                          ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                           (long)(local_454c - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)((local_454c + -1) - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1)) ||
               ((*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)((local_454c + 1) - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1 ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(local_454c - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)))) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_454c -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_454c - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_454c -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_454c + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_454c + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_454c - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_454c -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_454c + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_454c + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_454c - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_454c + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_454c + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_454c - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_454c -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_454c + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)((local_454c + 1) -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_454c + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_454c + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_454c + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_454c + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_454c + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_454c + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_454c -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_454c + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_454c + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_454c + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_454c + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar4 + 1;
        iVar10 = iVar6 + 1;
        for (local_4558 = iVar2; local_4558 <= iVar5; local_4558 = local_4558 + 1) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                       (long)(local_4558 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 0) {
            if (((*(int *)(*(long *)local_48a0 +
                          ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                           (long)(local_4558 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)((local_4558 + -1) - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1)) ||
               ((*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)((local_4558 + 1) - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1 ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                          (long)(local_4558 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar6 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                         * 4) == 1)))) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4558 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_4558 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_4558 -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4558 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4558 + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_4558 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_4558 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4558 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4558 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_4558 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4558 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4558 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_4558 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4558 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4558 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)((local_4558 + 1) -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4558 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4558 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4558 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4558 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4558 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4558 + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_4558 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4558 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4558 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4558 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4558 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar2 + -1;
        iVar10 = BVar3 - indexType;
        for (local_4564 = iVar1; local_4564 <= iVar4; local_4564 = local_4564 + 1) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(local_4564 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 0) {
            if ((((*(int *)(*(long *)local_48a0 +
                           ((long)((local_4564 + -1) - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                 (*(int *)(*(long *)local_48a0 +
                          ((long)((local_4564 + 1) - *(int *)(local_48a0 + 0x20)) +
                           (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(local_4564 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1)) ||
               (*(int *)(*(long *)local_48a0 +
                        ((long)(local_4564 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 1)) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_4564 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_4564 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_4564 -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(local_4564 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_4564 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_4564 + -1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_4564 + -1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_4564 + 1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_4564 + 1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_4564 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(local_4564 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_4564 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4564 + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4564 + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4564 + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4564 + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_4564 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4564 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1);
            }
          }
        }
        iVar9 = iVar2 + -1;
        iVar10 = iVar6 + 1;
        for (local_4570 = iVar1; local_4570 <= iVar4; local_4570 = local_4570 + 1) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(local_4570 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 0) {
            if (((*(int *)(*(long *)local_48a0 +
                          ((long)((local_4570 + -1) - *(int *)(local_48a0 + 0x20)) +
                           (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)((local_4570 + 1) - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1)) ||
               ((*(int *)(*(long *)local_48a0 +
                         ((long)(local_4570 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1 ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(local_4570 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar6 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                         * 4) == 1)))) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_4570 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_4570 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_4570 -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(local_4570 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_4570 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_4570 + -1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_4570 + -1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_4570 + 1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_4570 + 1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_4570 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(local_4570 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_4570 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4570 + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4570 + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4570 + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4570 + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_4570 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar2 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4570 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1);
            }
          }
        }
        iVar9 = iVar5 + 1;
        iVar10 = BVar3 - indexType;
        for (local_457c = iVar1; local_457c <= iVar4; local_457c = local_457c + 1) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(local_457c - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 0) {
            if (((*(int *)(*(long *)local_48a0 +
                          ((long)((local_457c + -1) - *(int *)(local_48a0 + 0x20)) +
                           (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)((local_457c + 1) - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1)) ||
               ((*(int *)(*(long *)local_48a0 +
                         ((long)(local_457c - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1 ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(local_457c - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                         *(long *)(local_48a0 + 0x10)) * 4) == 1)))) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_457c -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_457c - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_457c -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(local_457c - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_457c -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_457c + -1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_457c + -1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_457c + 1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_457c + 1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_457c - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(local_457c - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_457c -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_457c + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_457c + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_457c + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_457c + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_457c -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_457c + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar3 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1);
            }
          }
        }
        iVar9 = iVar5 + 1;
        iVar10 = iVar6 + 1;
        for (local_4588 = iVar1; local_4588 <= iVar4; local_4588 = local_4588 + 1) {
          if (*(int *)(*(long *)local_48a0 +
                      ((long)(local_4588 - *(int *)(local_48a0 + 0x20)) +
                       (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                       *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                      (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)) *
                      4) == 0) {
            if ((((*(int *)(*(long *)local_48a0 +
                           ((long)((local_4588 + -1) - *(int *)(local_48a0 + 0x20)) +
                            (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                            *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                           (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                           *(long *)(local_48a0 + 0x10)) * 4) == 1) ||
                 (*(int *)(*(long *)local_48a0 +
                          ((long)((local_4588 + 1) - *(int *)(local_48a0 + 0x20)) +
                           (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                           *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                          (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                          *(long *)(local_48a0 + 0x10)) * 4) == 1)) ||
                (*(int *)(*(long *)local_48a0 +
                         ((long)(local_4588 - *(int *)(local_48a0 + 0x20)) +
                          (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                          *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                         (long)(iVar10 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10)
                         ) * 4) == 1)) ||
               (*(int *)(*(long *)local_48a0 +
                        ((long)(local_4588 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar6 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 1)) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_4588 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_4588 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_4588 -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(local_4588 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_4588 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_4588 + -1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_4588 + -1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_4588 + 1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_4588 + 1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_4588 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(local_4588 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
            else {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_4588 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4588 + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4588 + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4588 + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_4588 + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar10 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_4588 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar5 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar10 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_4588 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar6 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1);
            }
          }
        }
        iVar9 = iVar1 + -1;
        for (BVar12 = BVar3; local_4594 = iVar2, (int)BVar12 <= iVar6; BVar12 = BVar12 + indexType)
        {
          for (; local_4594 <= iVar5; local_4594 = local_4594 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                         (long)(local_4594 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(int)(BVar12 - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_4594 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(BVar12 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_4594 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((BVar12 + indexType) - *(int *)(local_48a0 + 0x28))
                                    * *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_4594 -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((BVar12 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_4594 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((BVar12 - indexType) - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_4594 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((BVar12 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4594 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar12 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4594 + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar12 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_4594 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(BVar12 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_4594 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar12 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar1 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_4594 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar12 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4594 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar12 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_4594 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(BVar12 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_4594 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((BVar12 - indexType) - *(int *)(local_48a0 + 0x28))
                                    * *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_4594 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((BVar12 + indexType) - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar4 + 1;
        for (local_459c = BVar3; local_45a0 = iVar2, (int)local_459c <= iVar6;
            local_459c = local_459c + indexType) {
          for (; local_45a0 <= iVar5; local_45a0 = local_45a0 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                         (long)(local_45a0 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(int)(local_459c - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_45a0 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_459c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45a0 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_459c + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_45a0 -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_459c + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_45a0 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_459c - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_45a0 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_459c - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_45a0 + 1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_459c - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_45a0 + 1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_459c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)((local_45a0 + -1) - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_459c - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar9 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)((local_45a0 + -1) -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_459c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(iVar4 - *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_45a0 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_459c - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45a0 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_459c - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45a0 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_459c - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45a0 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_459c - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(iVar9 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(local_45a0 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_459c + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar2 + -1;
        for (local_45a8 = BVar3; local_45ac = iVar1, (int)local_45a8 <= iVar6;
            local_45a8 = local_45a8 + indexType) {
          for (; local_45ac <= iVar4; local_45ac = local_45ac + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(local_45ac - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(int)(local_45a8 - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_45ac -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_45a8 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_45ac - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_45a8 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_45ac -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_45a8 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(local_45ac - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_45a8 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_45ac -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_45a8 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_45ac + -1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_45a8 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_45ac + -1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_45a8 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_45ac + 1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_45a8 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_45ac + 1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_45a8 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_45ac -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar2 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_45a8 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_45ac + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_45a8 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_45ac + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_45a8 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_45ac - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_45a8 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(local_45ac - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_45a8 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = iVar5 + 1;
        for (local_45b4 = BVar3; local_45b8 = iVar1, (int)local_45b4 <= iVar6;
            local_45b4 = local_45b4 + indexType) {
          for (; local_45b8 <= iVar4; local_45b8 = local_45b8 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(local_45b8 - *(int *)(local_48a0 + 0x20)) +
                         (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(int)(local_45b4 - *(int *)(local_48a0 + 0x28)) *
                        *(long *)(local_48a0 + 0x10)) * 4) == 0) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_45b8 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4)) * (long)in_stack_ffffffffffffb6a0->arena +
                (long)(int)(local_45b4 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_45b8 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_45b4 + indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_45b8 -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                          
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(int)((local_45b4 + indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1)
                                 ) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)(local_45b8 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_45b4 - indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_45b8 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)((local_45b4 - indexType) - *(int *)(in_stack_ffffffffffffb6a0 + 1))
                     * (long)(in_stack_ffffffffffffb6a0->tags).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_45b8 + -1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_45b4 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_45b8 + -1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_45b4 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   (double)*(int *)(*(long *)local_48a0 +
                                   ((long)((local_45b8 + 1) - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)(local_45b4 - *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4) *
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)((local_45b8 + 1) -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar9 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_45b4 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_45b8 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(iVar5 - *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                                                                                        
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(local_45b4 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_45b8 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_45b4 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_45b8 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)(local_45b4 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1 +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_45b8 - *(int *)(local_48a0 + 0x20)) +
                                     (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(int)((local_45b4 - indexType) -
                                               *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                           *(int *)(*(long *)local_48a0 +
                                   ((long)(local_45b8 - *(int *)(local_48a0 + 0x20)) +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x24)) *
                                    *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                   (long)(int)((local_45b4 + indexType) -
                                              *(int *)(local_48a0 + 0x28)) *
                                   *(long *)(local_48a0 + 0x10)) * 4));
            }
          }
        }
        iVar9 = BVar3 - indexType;
        for (local_45c0 = iVar2; local_45c4 = iVar1, local_45c0 <= iVar5;
            local_45c0 = local_45c0 + 1) {
          for (; local_45c4 <= iVar4; local_45c4 = local_45c4 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(local_45c4 - *(int *)(local_48a0 + 0x20)) +
                         (long)(local_45c0 - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar9 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 0) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_45c4 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_45c0 -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_45c4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45c0 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_45c4 -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)((local_45c0 + 1) -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_45c4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45c0 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_45c4 -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)((local_45c0 + -1) -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_45c4 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45c0 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_45c4 + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_45c0 -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_45c4 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45c0 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_45c4 + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_45c0 -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_45c4 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_45c0 -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(int)(BVar3 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_45c4 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45c0 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_45c4 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45c0 - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_45c4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45c0 + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_45c4 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45c0 + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1);
            }
          }
        }
        iVar9 = iVar6 + 1;
        for (local_45cc = iVar2; local_45d0 = iVar1, local_45cc <= iVar5;
            local_45cc = local_45cc + 1) {
          for (; local_45d0 <= iVar4; local_45d0 = local_45d0 + 1) {
            if (*(int *)(*(long *)local_48a0 +
                        ((long)(local_45d0 - *(int *)(local_48a0 + 0x20)) +
                         (long)(local_45cc - *(int *)(local_48a0 + 0x24)) *
                         *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                        (long)(iVar9 - *(int *)(local_48a0 + 0x28)) * *(long *)(local_48a0 + 0x10))
                        * 4) == 0) {
              *(double *)
               (*(long *)in_stack_ffffffffffffb6a0 +
               ((long)(local_45d0 -
                      *(int *)&(in_stack_ffffffffffffb6a0->tags).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                (long)(local_45cc -
                      *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)) *
                (long)in_stack_ffffffffffffb6a0->arena +
                (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                (long)(in_stack_ffffffffffffb6a0->tags).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)local_445c *
               (long)(in_stack_ffffffffffffb6a0->tags).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) * 8) =
                   ((double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_45d0 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45cc + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_45d0 -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)((local_45cc + 1) -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)(local_45d0 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45cc + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)(local_45d0 -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)((local_45cc + -1) -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_45d0 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45cc - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_45d0 + -1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_45cc -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                    (double)*(int *)(*(long *)local_48a0 +
                                    ((long)((local_45d0 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45cc - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) *
                    *(double *)
                     (*(long *)in_stack_ffffffffffffb6a0 +
                     ((long)((local_45d0 + 1) -
                            *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                      (long)(local_45cc -
                            *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                      * (long)in_stack_ffffffffffffb6a0->arena +
                      (long)(iVar9 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                      (long)(in_stack_ffffffffffffb6a0->tags).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     (long)local_445c *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) * 8) +
                   *(double *)
                    (*(long *)in_stack_ffffffffffffb6a0 +
                    ((long)(local_45d0 -
                           *(int *)&(in_stack_ffffffffffffb6a0->tags).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                     (long)(local_45cc -
                           *(int *)((long)&(in_stack_ffffffffffffb6a0->tags).
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
                     * (long)in_stack_ffffffffffffb6a0->arena +
                     (long)(iVar6 - *(int *)(in_stack_ffffffffffffb6a0 + 1)) *
                     (long)(in_stack_ffffffffffffb6a0->tags).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                    (long)local_445c *
                    (long)(in_stack_ffffffffffffb6a0->tags).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) * 8)) /
                   (double)(*(int *)(*(long *)local_48a0 +
                                    ((long)((local_45d0 + -1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45cc - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)((local_45d0 + 1) - *(int *)(local_48a0 + 0x20)) +
                                     (long)(local_45cc - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_45d0 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45cc + -1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) +
                            *(int *)(*(long *)local_48a0 +
                                    ((long)(local_45d0 - *(int *)(local_48a0 + 0x20)) +
                                     (long)((local_45cc + 1) - *(int *)(local_48a0 + 0x24)) *
                                     *(long *)&((BoxArray *)(local_48a0 + 8))->m_bat +
                                    (long)(iVar9 - *(int *)(local_48a0 + 0x28)) *
                                    *(long *)(local_48a0 + 0x10)) * 4) + 1);
            }
          }
        }
      }
      local_48e8 = in_stack_ffffffffffffb6a0;
      MFIter::operator++(&local_4840);
    }
    MFIter::~MFIter((MFIter *)in_stack_ffffffffffffb680);
  }
  iMultiFab::~iMultiFab((iMultiFab *)0x113d3c9);
  return;
}

Assistant:

void FirstOrderExtrap (MultiFab& mf, const Geometry& geom, int scomp, int ncomp, int ngrow)
    {
        BL_ASSERT(mf.nGrow() >= ngrow);
        BL_ASSERT(scomp >= 0);
        BL_ASSERT((scomp+ncomp) <= mf.nComp());

        iMultiFab mask(mf.boxArray(), mf.DistributionMap(), 1, ngrow, MFInfo(),
                       DefaultFabFactory<IArrayBox>());
        mask.BuildMask(geom.Domain(), geom.periodicity(),
                       finebnd, crsebnd, physbnd, interior);

        // Do the extrap. on successive layers of ghost cells
        for (int layer = 0; layer < ngrow; layer++) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(mf); mfi.isValid(); ++mfi)
            {
                const Box& bx        = mfi.validbox();
                const Box& gbx       = amrex::grow(bx,layer);
                auto const& mask_arr = mask.const_array(mfi);
                auto const& data_arr = mf.array(mfi,scomp);

                if (Gpu::inLaunchRegion()) {
                    // set the crse cell to zero in the current layer
                    ParallelFor(amrex::grow(gbx,1), ncomp,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                    {
                       if (!gbx.contains(i,j,k)) {
                           if (mask_arr(i,j,k) == crsebnd) data_arr(i,j,k,n) = 0.0;
                       }
                    });
                    ParallelFor(amrex::grow(gbx,1), ncomp,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                    {
                       amrex_first_order_extrap_gpu(i, j, k, n, bx, mask_arr, data_arr);
                    });
                } else {
                    amrex_first_order_extrap_cpu(gbx, ncomp, mask_arr, data_arr);
                }
            }
        }
    }